

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void spr_write_hdecr(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGContext_conflict10 *tcg_ctx;
  int gprn_local;
  int sprn_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = tb_cflags((ctx->base).tb);
  if ((uVar1 & 0x20000) != 0) {
    gen_io_start(tcg_ctx_00);
  }
  gen_helper_store_hdecr(tcg_ctx_00,tcg_ctx_00->cpu_env,cpu_gpr[gprn]);
  uVar1 = tb_cflags((ctx->base).tb);
  if ((uVar1 & 0x20000) != 0) {
    gen_io_end(tcg_ctx_00);
    gen_stop_exception(ctx);
  }
  return;
}

Assistant:

static void spr_write_hdecr(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    gen_helper_store_hdecr(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[gprn]);
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_end(tcg_ctx);
        gen_stop_exception(ctx);
    }
}